

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVirtualProtocol.h
# Opt level: O2

uint32_t __thiscall
duckdb_apache::thrift::protocol::
TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::ThriftFileTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
::readBool_virt(TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::ThriftFileTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
                *this,reference value)

{
  uint32_t uVar1;
  
  uVar1 = readBool(this,value);
  return uVar1;
}

Assistant:

uint32_t readBool_virt(duckdb::vector<bool>::reference value) override {
    return static_cast<Protocol_*>(this)->readBool(value);
  }